

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_constraint.cpp
# Opt level: O1

void __thiscall
duckdb::ForeignKeyConstraint::Serialize(ForeignKeyConstraint *this,Serializer *serializer)

{
  (*serializer->_vptr_Serializer[2])(serializer,100,"type");
  Serializer::WriteValue<duckdb::ConstraintType>(serializer,(this->super_Constraint).type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,200,"pk_columns",&this->pk_columns);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0xc9,"fk_columns",&this->fk_columns);
  (*serializer->_vptr_Serializer[2])(serializer,0xca,"fk_type");
  Serializer::WriteValue<duckdb::ForeignKeyType>(serializer,(this->info).type);
  (*serializer->_vptr_Serializer[3])(serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcb,"schema",&(this->info).schema);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xcc,"table",&(this->info).table);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0xcd,"pk_keys",&(this->info).pk_keys);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0xce,"fk_keys",&(this->info).fk_keys);
  return;
}

Assistant:

void ForeignKeyConstraint::Serialize(Serializer &serializer) const {
	Constraint::Serialize(serializer);
	serializer.WritePropertyWithDefault<vector<string>>(200, "pk_columns", pk_columns);
	serializer.WritePropertyWithDefault<vector<string>>(201, "fk_columns", fk_columns);
	serializer.WriteProperty<ForeignKeyType>(202, "fk_type", info.type);
	serializer.WritePropertyWithDefault<string>(203, "schema", info.schema);
	serializer.WritePropertyWithDefault<string>(204, "table", info.table);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(205, "pk_keys", info.pk_keys);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(206, "fk_keys", info.fk_keys);
}